

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O3

int __thiscall
MODEL3D::three_dim_model::generate_model
          (three_dim_model *this,string *gds_path,string *pif_path,string *py_path,string *cont_path
          ,bool *multi_flag)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  pointer pcVar4;
  int iVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  int iVar10;
  _Self __tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_string_vector;
  section_data section_polygon_only;
  gdscpp gds_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  size_t local_208;
  anon_union_16_2_ba345be5_for_m_Storage local_200;
  ulong local_1f0;
  string local_1e8;
  string local_1c8;
  iterator_range<const_char_*> local_1a8;
  section_data local_198;
  gdscpp local_f0;
  
  gdscpp::gdscpp(&local_f0);
  local_198.polygons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_198.polygons._M_t._M_impl.super__Rb_tree_header._M_header;
  local_198.polygons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_198.polygons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_198.polygons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_198.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_198.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_198.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_198.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_198.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header;
  local_198.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_198.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_198.section_blocks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198.x1 = 0;
  local_198.y1 = 0;
  local_198.x2 = 0;
  local_198.y2 = 0;
  local_198.axis_type = 0;
  local_198.xsec_distance = 0;
  this->enable_multiprocessing = *multi_flag;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
       "./\\";
  local_1a8.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End = "";
  local_198.polygons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_198.polygons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_198.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_198.layer_intercepts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_198.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_198.section_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_200,&local_1a8);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            (&local_228,py_path,(is_any_ofF<char> *)&local_200,token_compress_off);
  if ((0x10 < local_1f0) && (local_200.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_200.m_dynSet);
  }
  std::__cxx11::string::_M_assign((string *)&this->cell_name);
  pcVar4 = (gds_path->_M_dataplus)._M_p;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar4,pcVar4 + gds_path->_M_string_length);
  iVar5 = gdscpp::import(&local_f0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  iVar10 = 1;
  if (iVar5 == 0) {
    import_process_info(this,pif_path);
    iVar5 = load_etch_contour_map(this,cont_path);
    if (iVar5 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Beginning GDS expansion process...",0x22);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      iVar5 = section_data::extract_all_polygons(&local_198,&local_f0,&this->polygons_map);
      if (iVar5 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"GDS expansion completed.",0x18);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
      }
      calculate_all_layer_bounds(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Converting polygons to clipper format...",0x28);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      synchronize_clipper_polygons_map(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Polygon map ready.",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "# ------------------------- Generating 3D Layers ------------------------- #",0x4c
                );
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      local_208 = (this->polygons_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      initialize_python_script(this);
      p_Var1 = &(this->polygons_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (this->polygons_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var7 != p_Var1) {
        p_Var2 = &(this->proc_info_map)._M_t._M_impl.super__Rb_tree_header;
        iVar5 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Generating Layer ",0x11);
          iVar5 = iVar5 + 1;
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t---> ",6);
          p_Var8 = (this->proc_info_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var8 != (_Base_ptr)0x0) {
            _Var3 = p_Var7[1]._M_color;
            p_Var9 = &p_Var2->_M_header;
            do {
              if ((int)_Var3 <= (int)*(size_t *)(p_Var8 + 1)) {
                p_Var9 = p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < (int)_Var3];
            } while (p_Var8 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var9 != p_Var2) &&
               ((int)((_Rb_tree_header *)p_Var9)->_M_node_count <= (int)_Var3)) {
              local_1a8.
              super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>
              .m_Begin = (char *)CONCAT44(local_1a8.
                                          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
                                          .
                                          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>
                                          .
                                          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>
                                          .m_Begin._4_4_,_Var3);
              generate_layer(this,(int *)&local_1a8);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.",5);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          std::ostream::flush();
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while ((_Rb_tree_header *)p_Var7 != p_Var1);
      }
      python_script_conclude(this);
      pcVar4 = (py_path->_M_dataplus)._M_p;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,pcVar4,pcVar4 + py_path->_M_string_length);
      python_script_write(this,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "# ----------------------- Model Generation Complete ---------------------- #",0x4c
                );
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      iVar10 = 0;
      std::ostream::flush();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::map<int,_building_blocks,_std::less<int>,_std::allocator<std::pair<const_int,_building_blocks>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_building_blocks,_std::less<int>,_std::allocator<std::pair<const_int,_building_blocks>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_building_blocks,_std::less<int>,_std::allocator<std::pair<const_int,_building_blocks>_>_>_>_>_>
  ::~_Rb_tree(&local_198.section_blocks._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>_>
  ::~_Rb_tree(&local_198.layer_intercepts._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
               *)&local_198);
  gdscpp::~gdscpp(&local_f0);
  return iVar10;
}

Assistant:

int MODEL3D::three_dim_model::generate_model(
const std::string &gds_path,
const std::string &pif_path,
const std::string &py_path,
const std::string &cont_path,
const bool        &multi_flag)
{
    gdscpp gds_file;
    section_data section_polygon_only;
    enable_multiprocessing = multi_flag;
    std::vector<std::string> split_string_vector;
    boost::split(split_string_vector, py_path, boost::is_any_of("./\\"));
    cell_name = *std::prev(split_string_vector.end(),2);;
    if(gds_file.import(gds_path)==EXIT_SUCCESS)
    {
        import_process_info(pif_path);
        if(load_etch_contour_map(cont_path)==EXIT_SUCCESS)
        {
            // Populate polygon map with all GDS data
            std::cout<<"Beginning GDS expansion process..."<<std::endl;
            if(section_polygon_only.extract_all_polygons(gds_file, polygons_map)==EXIT_SUCCESS)
                std::cout<<"GDS expansion completed."<<std::endl;
            calculate_all_layer_bounds();
            // Convert map to clipper library compatible form
            std::cout<<"Converting polygons to clipper format..."<<std::endl;
            synchronize_clipper_polygons_map();
            std::cout<<"Polygon map ready."<<std::endl;
            // Generate a volume for each layer
            std::cout<< "# ------------------------- Generating 3D Layers ------------------------- #"<<std::endl;
            auto layer_end = polygons_map.end();
            int layer_count = 0;
            size_t total_layers = polygons_map.size();
            // if all layer contours are loaded
            // else state that a layer contour is missing
            // int p_cnt = 0;
            // int ln_cnt = 0;
            // int cl_cnt = 0;
            // int ps_cnt = 0;
            // int sl_cnt = 0;
            // int vl_cnt = 0;
            initialize_python_script();
            for (auto layer = polygons_map.begin(); layer != layer_end; layer++)
            {
                std::cout << "Generating Layer "
                << ++layer_count << "/" << total_layers
                << "\t---> ";
                if(proc_info_map.find(layer->first)!=proc_info_map.end())
                    generate_layer(layer->first);
                std::cout << "Done." << std::endl;
            }
            // generate_layer(60);
            python_script_conclude();
            python_script_write(py_path);
            std::cout<< "# ----------------------- Model Generation Complete ---------------------- #"<<std::endl;
            return EXIT_SUCCESS;
        }
        else
            return EXIT_FAILURE;
    }
    else
        return EXIT_FAILURE;
}